

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

string_char lsvm::string::next(iterator *it)

{
  byte bVar1;
  uint32_t uVar2;
  string *psVar3;
  uint32_t uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lStack_8;
  
  psVar3 = it->s;
  uVar2 = psVar3->size;
  uVar4 = it->p;
  if ((int)uVar4 < (int)uVar2) {
    uVar4 = uVar4 + 1;
    it->p = uVar4;
  }
  uVar5 = 0;
  if (uVar2 != uVar4) {
    lVar7 = (long)(int)uVar4;
    bVar1 = *(byte *)((long)&psVar3[1].count + lVar7);
    uVar5 = (uint)bVar1;
    if (-1 < (char)bVar1) {
      return uVar5;
    }
    if (bVar1 < 0xe0) {
      uVar5 = (uVar5 & 0x1f) << 6;
      iVar6 = 1;
      lStack_8 = 1;
    }
    else if (bVar1 < 0xf0) {
      uVar5 = (*(byte *)((long)&psVar3[1].count + lVar7 + 1) & 0x3f | (uVar5 & 0xf) << 6) << 6;
      iVar6 = 2;
      lStack_8 = 2;
    }
    else {
      if (0xf4 < bVar1) {
        return 0;
      }
      uVar5 = (*(byte *)((long)&psVar3[1].count + lVar7 + 2) & 0x3f) << 6 |
              (*(byte *)((long)&psVar3[1].count + lVar7 + 1) & 0x3f | (uVar5 & 7) << 6) << 0xc;
      iVar6 = 3;
      lStack_8 = 3;
    }
    uVar5 = *(byte *)((long)&psVar3[1].count + lStack_8 + lVar7) & 0x3f | uVar5;
    it->p = uVar4 + iVar6;
  }
  return uVar5;
}

Assistant:

string_char next(iterator* it){
    string_char sc = 0;    
    if((int32_t)it->s->size > it->p)
        it->p += 1;
    if((int32_t)it->s->size == it->p)
        return null;

    uint8_t* s = reinterpret_cast<uint8_t*>(it->s+1);
    s += it->p;
    
    if (*s < 0x80) {
        sc = (*s & 0x7F);
    } else if (*s < 0xE0) {
        sc = (*s & 0x1F);
        sc <<= 6;
        sc |= (*(s+1) & 0x3F);
        it->p += 1;
    } else if (*s < 0xF0) {
        sc = (*s & 0xF);
        sc <<= 6;
        sc |= (*(s+1) & 0x3F);
        sc <<= 6;
        sc |= (*(s+2) & 0x3F);
        it->p += 2;
    } else if (*s < 0xF5) {
        sc = (*s & 0x7);
        sc <<= 6;
        sc |= (*(s+1) & 0x3F);
        sc <<= 6;
        sc |= (*(s+2) & 0x3F);
        sc <<= 6;
        sc |= (*(s+3) & 0x3F);
        it->p += 3;
    }

    return sc;
}